

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ArrayQueryFunction::checkArguments
          (ArrayQueryFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Expression *pEVar2;
  bool bVar3;
  bitwidth_t bVar4;
  Type *pTVar5;
  Diagnostic *this_00;
  SourceLocation SVar6;
  DiagCode code;
  SourceRange sourceRange;
  int32_t knownIndex;
  SourceLocation SVar7;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = ast::SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,2);
  if (!bVar3) goto LAB_0039e6df;
  pTVar5 = ((*args->_M_ptr)->type).ptr;
  bVar3 = Type::isIntegral(pTVar5);
  if ((((!bVar3) && (bVar3 = Type::isUnpackedArray(pTVar5), !bVar3)) &&
      (bVar3 = Type::isString(pTVar5), !bVar3)) || (bVar3 = Type::isScalar(pTVar5), bVar3)) {
    pTVar5 = ast::SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
    return pTVar5;
  }
  bVar3 = Type::hasFixedRange(pTVar5);
  if ((!bVar3) && (pEVar2 = *args->_M_ptr, pEVar2->kind == DataType)) {
    SVar7 = (pEVar2->sourceRange).startLoc;
    SVar6 = (pEVar2->sourceRange).endLoc;
    code.subsystem = SysFuncs;
    code.code = 0x21;
LAB_0039e6cb:
    sourceRange.endLoc = SVar6;
    sourceRange.startLoc = SVar7;
    this_00 = ASTContext::addDiag(context,code,sourceRange);
    Diagnostic::operator<<(this_00,&(this->super_SystemSubroutine).name);
LAB_0039e6df:
    return pCVar1->errorType;
  }
  knownIndex = 0;
  if ((args->_M_extent)._M_extent_value < 2) {
    knownIndex = 1;
  }
  else {
    bVar3 = Type::isIntegral((args->_M_ptr[1]->type).ptr);
    if (!bVar3) {
      pTVar5 = ast::SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[1]);
      return pTVar5;
    }
    if ((((context->flags).m_bits & 2) == 0) && (bVar3 = checkDim(context,args,&knownIndex), !bVar3)
       ) goto LAB_0039e6df;
  }
  bVar3 = Type::isAssociativeArray(pTVar5);
  if (!bVar3) goto LAB_0039e695;
  pTVar5 = Type::getAssociativeIndexType(pTVar5);
  if (knownIndex != 0) {
    if ((pTVar5 == (Type *)0x0) || (bVar3 = Type::isIntegral(pTVar5), !bVar3)) {
      SVar7 = ((*args->_M_ptr)->sourceRange).startLoc;
      SVar6 = ((*args->_M_ptr)->sourceRange).endLoc;
      code.subsystem = SysFuncs;
      code.code = 0x20;
      goto LAB_0039e6cb;
    }
    if (knownIndex != 0) {
      return pTVar5;
    }
  }
  bVar4 = Type::getBitWidth(pTVar5);
  if (0x20 < bVar4) {
    return pTVar5;
  }
LAB_0039e695:
  return pCVar1->integerType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 2))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if ((!type.isIntegral() && !type.isUnpackedArray() && !type.isString()) || type.isScalar())
            return badArg(context, *args[0]);

        // Spec says we have to disallow this case.
        if (!type.hasFixedRange() && args[0]->kind == ExpressionKind::DataType) {
            context.addDiag(diag::QueryOnDynamicType, args[0]->sourceRange) << name;
            return comp.getErrorType();
        }

        int32_t knownIndex = 0;
        if (args.size() > 1) {
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);

            // Try to verify the dimension index if it's a constant.
            if (!context.inUnevaluatedBranch() && !checkDim(context, args, knownIndex))
                return comp.getErrorType();
        }
        else {
            // Index defaults to 1 if not provided.
            knownIndex = 1;
        }

        if (type.isAssociativeArray()) {
            // If the first argument is an associative array and we know we're selecting it,
            // ensure that the index type is integral.
            auto indexType = type.getAssociativeIndexType();
            if (knownIndex && (!indexType || !indexType->isIntegral())) {
                context.addDiag(diag::QueryOnAssociativeWildcard, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }

            // If the index is known, the result type is the index type.
            if (knownIndex)
                return *indexType;

            // If the index is unknown, we don't know if they will select the associative array
            // or some other dimension. Use the index type if it's larger than a normal integer,
            // and otherwise just use an integer result type.
            if (indexType->getBitWidth() > 32)
                return *indexType;
        }

        return comp.getIntegerType();
    }